

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool __thiscall
Chainstate::ActivateBestChainStep
          (Chainstate *this,BlockValidationState *state,CBlockIndex *pindexMostWork,
          shared_ptr<const_CBlock> *pblock,bool *fInvalidFound,ConnectTrace *connectTrace)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  CBlockIndex *state_00;
  CBlockIndex *disconnectpool_00;
  CBlockIndex *pCVar4;
  int *piVar5;
  DisconnectedBlockTransactions *disconnectpool_01;
  reference ppCVar6;
  Chainstate *in_RDX;
  vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> *in_RSI;
  CBlockIndex *in_RDI;
  undefined1 *in_R8;
  Chainstate *in_R9;
  long in_FS_OFFSET;
  bool bVar7;
  bool bVar8;
  CBlockIndex *pindexConnect;
  reverse_view<std::ranges::ref_view<std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>_>_>
  *__range2;
  int nTargetHeight;
  int nHeight;
  bool fContinue;
  bool fBlocksDisconnected;
  CBlockIndex *pindexFork;
  CBlockIndex *pindexOldTip;
  reverse_iterator<__gnu_cxx::__normal_iterator<CBlockIndex_**,_std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>_>_>
  __end2;
  reverse_iterator<__gnu_cxx::__normal_iterator<CBlockIndex_**,_std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>_>_>
  __begin2;
  CBlockIndex *pindexIter;
  vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> vpindexToConnect;
  DisconnectedBlockTransactions disconnectpool;
  undefined4 in_stack_fffffffffffffd58;
  int in_stack_fffffffffffffd5c;
  undefined4 in_stack_fffffffffffffd60;
  int in_stack_fffffffffffffd64;
  undefined4 in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd6c;
  reverse_view<std::ranges::ref_view<std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>_>_>
  *in_stack_fffffffffffffd70;
  Chainstate *in_stack_fffffffffffffd78;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  DisconnectedBlockTransactions *in_stack_fffffffffffffd88;
  BlockValidationResult in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd94;
  undefined1 in_stack_fffffffffffffd95;
  byte in_stack_fffffffffffffd96;
  undefined1 in_stack_fffffffffffffd97;
  vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> *in_stack_fffffffffffffd98;
  ConstevalStringLiteral in_stack_fffffffffffffda8;
  Chainstate *in_stack_fffffffffffffdc8;
  int local_21c;
  Chainstate *this_00;
  int local_1cc;
  undefined4 in_stack_fffffffffffffe3c;
  DisconnectedBlockTransactions *in_stack_fffffffffffffe40;
  Chainstate *in_stack_fffffffffffffe48;
  bool local_159;
  Chainstate *local_138;
  undefined1 local_a0 [80];
  ConnectTrace *in_stack_ffffffffffffffb8;
  shared_ptr<const_CBlock> *in_stack_ffffffffffffffc0;
  CBlockIndex *in_stack_ffffffffffffffc8;
  BlockValidationState *in_stack_ffffffffffffffd0;
  Chainstate *in_stack_ffffffffffffffd8;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
             (char *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             in_stack_fffffffffffffd5c,(AnnotatedMixin<std::recursive_mutex> *)0x7d943b);
  if (*(long *)(in_RDI->nChainWork).super_base_uint<256U>.pn != 0) {
    AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
              ((char *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
               (char *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
               in_stack_fffffffffffffd5c,(AnnotatedMixin<std::recursive_mutex> *)0x7d9472);
  }
  state_00 = CChain::Tip((CChain *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  disconnectpool_00 =
       CChain::FindFork((CChain *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                        (CBlockIndex *)in_stack_fffffffffffffd78);
  bVar3 = false;
  DisconnectedBlockTransactions::DisconnectedBlockTransactions
            (in_stack_fffffffffffffd88,CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80)
            );
  while( true ) {
    pCVar4 = CChain::Tip((CChain *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    bVar7 = false;
    if (pCVar4 != (CBlockIndex *)0x0) {
      pCVar4 = CChain::Tip((CChain *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      bVar7 = pCVar4 != disconnectpool_00;
    }
    if (!bVar7) {
      std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::vector
                ((vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> *)
                 CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      bVar7 = true;
      if (disconnectpool_00 == (CBlockIndex *)0x0) {
        local_21c = -1;
      }
      else {
        local_21c = disconnectpool_00->nHeight;
      }
      local_1cc = local_21c;
      goto LAB_007d96c6;
    }
    bVar3 = DisconnectTip(in_R9,(BlockValidationState *)state_00,
                          (DisconnectedBlockTransactions *)disconnectpool_00);
    if (!bVar3) break;
    bVar3 = true;
  }
  MaybeUpdateMempoolForReorg
            (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
             SUB41((uint)in_stack_fffffffffffffe3c >> 0x18,0));
  ChainstateManager::GetNotifications
            ((ChainstateManager *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  ::_(in_stack_fffffffffffffda8);
  FatalError((Notifications *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
             (BlockValidationState *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             (bilingual_str *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  bilingual_str::~bilingual_str
            ((bilingual_str *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  local_159 = false;
LAB_007d9beb:
  DisconnectedBlockTransactions::~DisconnectedBlockTransactions
            ((DisconnectedBlockTransactions *)
             CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return local_159;
LAB_007d96c6:
  bVar8 = false;
  if (bVar7) {
    bVar8 = local_1cc !=
            *(int *)((long)&(in_RDX->m_chainstate_mutex).super_mutex.super___mutex_base._M_mutex +
                    0x18);
  }
  if (!bVar8) {
    if (bVar3) {
      MaybeUpdateMempoolForReorg
                (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                 SUB41((uint)in_stack_fffffffffffffe3c >> 0x18,0));
    }
    if (*(long *)(in_RDI->nChainWork).super_base_uint<256U>.pn != 0) {
      CoinsTip(in_stack_fffffffffffffd78);
      in_stack_fffffffffffffd6c =
           CChain::Height((CChain *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      CTxMemPool::check((CTxMemPool *)disconnectpool.iters_by_txid._M_h._M_buckets,
                        (CCoinsViewCache *)
                        disconnectpool.iters_by_txid._M_h.
                        super__Hashtable_base<uint256,_std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        .
                        super__Hash_code_base<uint256,_std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>,_std::__detail::_Select1st,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
                        .super__Hashtable_ebo_helper<1,_SaltedTxidHasher,_false>._M_tp.k1,
                        disconnectpool.iters_by_txid._M_h.
                        super__Hashtable_base<uint256,_std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        .
                        super__Hash_code_base<uint256,_std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>,_std::__detail::_Select1st,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
                        .super__Hashtable_ebo_helper<1,_SaltedTxidHasher,_false>._M_tp.k0);
    }
    CheckForkWarningConditions(in_stack_fffffffffffffdc8);
    local_159 = true;
LAB_007d9bcd:
    std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::~vector
              ((vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> *)
               CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    goto LAB_007d9beb;
  }
  piVar5 = std::min<int>((int *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                         (int *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  iVar1 = *piVar5;
  std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::clear
            ((vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> *)
             CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::reserve
            (in_stack_fffffffffffffd98,
             CONCAT17(in_stack_fffffffffffffd97,
                      CONCAT16(in_stack_fffffffffffffd96,
                               CONCAT15(in_stack_fffffffffffffd95,
                                        CONCAT14(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90
                                                )))));
  in_stack_fffffffffffffdc8 =
       (Chainstate *)
       CBlockIndex::GetAncestor
                 ((CBlockIndex *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                  in_stack_fffffffffffffd64);
  local_138 = in_stack_fffffffffffffdc8;
  while( true ) {
    bVar8 = false;
    if (local_138 != (Chainstate *)0x0) {
      bVar8 = *(int *)((long)&(local_138->m_chainstate_mutex).super_mutex.super___mutex_base.
                              _M_mutex + 0x18) != local_1cc;
    }
    if (!bVar8) break;
    std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::push_back
              ((vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> *)
               CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
               (value_type *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    local_138 = *(Chainstate **)
                 ((long)&(local_138->m_chainstate_mutex).super_mutex.super___mutex_base._M_mutex + 8
                 );
  }
  disconnectpool_01 =
       (DisconnectedBlockTransactions *)
       std::ranges::views::__adaptor::
       operator|<const_std::ranges::views::_Reverse_&,_std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>_&>
                 ((vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> *)
                  CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                  (_Reverse *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
  std::ranges::
  reverse_view<std::ranges::ref_view<std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>_>_>
  ::begin(in_stack_fffffffffffffd70);
  std::ranges::
  reverse_view<std::ranges::ref_view<std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>_>_>
  ::end(in_stack_fffffffffffffd70);
  while (bVar8 = std::
                 operator==<__gnu_cxx::__normal_iterator<CBlockIndex_**,_std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>_>_>
                           ((reverse_iterator<__gnu_cxx::__normal_iterator<CBlockIndex_**,_std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                            (reverse_iterator<__gnu_cxx::__normal_iterator<CBlockIndex_**,_std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60)),
        local_1cc = iVar1, ((bVar8 ^ 0xffU) & 1) != 0) {
    ppCVar6 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<CBlockIndex_**,_std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<CBlockIndex_**,_std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>_>_>
                           *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    this_00 = (Chainstate *)*ppCVar6;
    in_stack_fffffffffffffd98 = in_RSI;
    if (this_00 == in_RDX) {
      std::shared_ptr<const_CBlock>::shared_ptr
                ((shared_ptr<const_CBlock> *)
                 CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                 (shared_ptr<const_CBlock> *)0x7d9926);
    }
    else {
      std::shared_ptr<const_CBlock>::shared_ptr
                ((shared_ptr<const_CBlock> *)
                 CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    }
    in_stack_fffffffffffffd97 =
         ConnectTip(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                    in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,disconnectpool_01);
    in_stack_fffffffffffffd96 = in_stack_fffffffffffffd97 ^ 0xff;
    std::shared_ptr<const_CBlock>::~shared_ptr
              ((shared_ptr<const_CBlock> *)
               CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    if ((in_stack_fffffffffffffd96 & 1) != 0) {
      in_stack_fffffffffffffd95 =
           ValidationState<BlockValidationResult>::IsInvalid
                     ((ValidationState<BlockValidationResult> *)
                      CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      if (!(bool)in_stack_fffffffffffffd95) {
        MaybeUpdateMempoolForReorg
                  (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                   SUB41((uint)in_stack_fffffffffffffe3c >> 0x18,0));
        local_159 = false;
        goto LAB_007d9bcd;
      }
      in_stack_fffffffffffffd90 =
           ValidationState<BlockValidationResult>::GetResult
                     ((ValidationState<BlockValidationResult> *)
                      CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      if (in_stack_fffffffffffffd90 != BLOCK_MUTATED) {
        std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::front
                  ((vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> *)
                   CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
        InvalidChainFound(this_00,in_RDI);
      }
      memset(local_a0,0,0x48);
      BlockValidationState::BlockValidationState
                ((BlockValidationState *)
                 CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      BlockValidationState::operator=
                ((BlockValidationState *)
                 CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                 (BlockValidationState *)
                 CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      BlockValidationState::~BlockValidationState
                ((BlockValidationState *)
                 CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      *in_R8 = 1;
      bVar7 = false;
      break;
    }
    PruneBlockIndexCandidates
              ((Chainstate *)
               CONCAT17(in_stack_fffffffffffffd97,
                        CONCAT16(in_stack_fffffffffffffd96,
                                 CONCAT15(in_stack_fffffffffffffd95,
                                          CONCAT14(in_stack_fffffffffffffd94,
                                                   in_stack_fffffffffffffd90)))));
    if (state_00 == (CBlockIndex *)0x0) {
LAB_007d9afd:
      bVar7 = false;
      break;
    }
    CChain::Tip((CChain *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    bVar8 = operator>((base_uint<256U> *)
                      CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                      (base_uint<256U> *)
                      CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    if (bVar8) goto LAB_007d9afd;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<CBlockIndex_**,_std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<CBlockIndex_**,_std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  }
  goto LAB_007d96c6;
}

Assistant:

bool Chainstate::ActivateBestChainStep(BlockValidationState& state, CBlockIndex* pindexMostWork, const std::shared_ptr<const CBlock>& pblock, bool& fInvalidFound, ConnectTrace& connectTrace)
{
    AssertLockHeld(cs_main);
    if (m_mempool) AssertLockHeld(m_mempool->cs);

    const CBlockIndex* pindexOldTip = m_chain.Tip();
    const CBlockIndex* pindexFork = m_chain.FindFork(pindexMostWork);

    // Disconnect active blocks which are no longer in the best chain.
    bool fBlocksDisconnected = false;
    DisconnectedBlockTransactions disconnectpool{MAX_DISCONNECTED_TX_POOL_BYTES};
    while (m_chain.Tip() && m_chain.Tip() != pindexFork) {
        if (!DisconnectTip(state, &disconnectpool)) {
            // This is likely a fatal error, but keep the mempool consistent,
            // just in case. Only remove from the mempool in this case.
            MaybeUpdateMempoolForReorg(disconnectpool, false);

            // If we're unable to disconnect a block during normal operation,
            // then that is a failure of our local system -- we should abort
            // rather than stay on a less work chain.
            FatalError(m_chainman.GetNotifications(), state, _("Failed to disconnect block."));
            return false;
        }
        fBlocksDisconnected = true;
    }

    // Build list of new blocks to connect (in descending height order).
    std::vector<CBlockIndex*> vpindexToConnect;
    bool fContinue = true;
    int nHeight = pindexFork ? pindexFork->nHeight : -1;
    while (fContinue && nHeight != pindexMostWork->nHeight) {
        // Don't iterate the entire list of potential improvements toward the best tip, as we likely only need
        // a few blocks along the way.
        int nTargetHeight = std::min(nHeight + 32, pindexMostWork->nHeight);
        vpindexToConnect.clear();
        vpindexToConnect.reserve(nTargetHeight - nHeight);
        CBlockIndex* pindexIter = pindexMostWork->GetAncestor(nTargetHeight);
        while (pindexIter && pindexIter->nHeight != nHeight) {
            vpindexToConnect.push_back(pindexIter);
            pindexIter = pindexIter->pprev;
        }
        nHeight = nTargetHeight;

        // Connect new blocks.
        for (CBlockIndex* pindexConnect : vpindexToConnect | std::views::reverse) {
            if (!ConnectTip(state, pindexConnect, pindexConnect == pindexMostWork ? pblock : std::shared_ptr<const CBlock>(), connectTrace, disconnectpool)) {
                if (state.IsInvalid()) {
                    // The block violates a consensus rule.
                    if (state.GetResult() != BlockValidationResult::BLOCK_MUTATED) {
                        InvalidChainFound(vpindexToConnect.front());
                    }
                    state = BlockValidationState();
                    fInvalidFound = true;
                    fContinue = false;
                    break;
                } else {
                    // A system error occurred (disk space, database error, ...).
                    // Make the mempool consistent with the current tip, just in case
                    // any observers try to use it before shutdown.
                    MaybeUpdateMempoolForReorg(disconnectpool, false);
                    return false;
                }
            } else {
                PruneBlockIndexCandidates();
                if (!pindexOldTip || m_chain.Tip()->nChainWork > pindexOldTip->nChainWork) {
                    // We're in a better position than we were. Return temporarily to release the lock.
                    fContinue = false;
                    break;
                }
            }
        }
    }

    if (fBlocksDisconnected) {
        // If any blocks were disconnected, disconnectpool may be non empty.  Add
        // any disconnected transactions back to the mempool.
        MaybeUpdateMempoolForReorg(disconnectpool, true);
    }
    if (m_mempool) m_mempool->check(this->CoinsTip(), this->m_chain.Height() + 1);

    CheckForkWarningConditions();

    return true;
}